

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_CheckIfTargetInLOS
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  DAngle angle;
  uint uVar1;
  VMValue *pVVar2;
  bool bVar3;
  double local_130;
  bool local_125;
  bool local_123;
  int u_9;
  int u_8;
  undefined1 local_110 [16];
  DAngle an;
  undefined4 local_e4;
  undefined4 local_e0;
  int u_7;
  int u_6;
  int u_5;
  double distance;
  int u_4;
  int u_3;
  undefined1 local_c0 [4];
  int u_2;
  TAngle<double> local_b8;
  undefined1 local_b0 [20];
  int u_1;
  int u;
  byte local_91;
  undefined1 auStack_90 [7];
  bool doCheckSight;
  FTranslatedLineTarget t;
  AActor *viewport;
  AActor *target;
  double dist_close;
  double dist_max;
  int flags;
  DAngle fov;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1095,
                  "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1095,
                  "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  fov.Degrees = *(double *)&param->field_0;
  local_123 = true;
  if ((DObject *)fov.Degrees != (DObject *)0x0) {
    local_123 = DObject::IsKindOf((DObject *)fov.Degrees,AActor::RegistrationInfo.MyClass);
  }
  if (local_123 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1095,
                  "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffffb8);
  if (numparam < 2) {
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
    if ((pVVar2->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1096,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
    TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffffb8,(pVVar2->field_0).f);
  }
  else {
    if (param[1].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1096,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffffb8,param[1].field_0.f);
  }
  if (numparam < 3) {
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    if ((pVVar2->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1097,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    dist_max._4_4_ = (pVVar2->field_0).i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1097,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    dist_max._4_4_ = param[2].field_0.i;
  }
  if (numparam < 4) {
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    if ((pVVar2->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1098,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    dist_close = (pVVar2->field_0).f;
  }
  else {
    if (param[3].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1098,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    dist_close = param[3].field_0.f;
  }
  if (numparam < 5) {
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
    if ((pVVar2->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1099,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
    target = (AActor *)(pVVar2->field_0).field_1.a;
  }
  else {
    if (param[4].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1099,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    target = (AActor *)param[4].field_0.field_1.a;
  }
  FTranslatedLineTarget::FTranslatedLineTarget((FTranslatedLineTarget *)auStack_90);
  angle = fov;
  if (*(long *)((long)fov.Degrees + 0x230) == 0) {
    if ((dist_max._4_4_ & 0x40) == 0) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                ((TFlags<ActorFlag,_unsigned_int> *)&u,
                 SUB84(fov.Degrees,0) +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&u);
      if ((uVar1 == 0) || (bVar3 = true, (dist_max._4_4_ & 1) == 0)) {
        bVar3 = (dist_max._4_4_ & 0x1000) != 0;
      }
      if (bVar3) {
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  ((TFlags<ActorFlag2,_unsigned_int> *)&u_1,
                   SUB84(fov.Degrees,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
        uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&u_1);
        local_125 = uVar1 == 0 && (dist_max._4_4_ & 0x1000) == 0;
        if (local_125) {
          viewport = (AActor *)0x0;
        }
        else {
          viewport = TObjPtr::operator_cast_to_AActor_((TObjPtr *)((long)fov.Degrees + 0x278));
        }
      }
      else {
        viewport = TObjPtr::operator_cast_to_AActor_((TObjPtr *)((long)fov.Degrees + 0x208));
      }
    }
    else {
      viewport = TObjPtr::operator_cast_to_AActor_((TObjPtr *)((long)fov.Degrees + 0x280));
    }
    if (viewport == (AActor *)0x0) {
      local_b0._16_4_ = 0;
      if (numret < 1) {
        return 0;
      }
      if (ret != (VMReturn *)0x0) {
        VMReturn::SetInt(ret,0);
        return 1;
      }
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x10b4,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (((dist_max._4_4_ & 0x20) != 0) && (viewport->health < 1)) {
      local_b0._12_4_ = 0;
      if (numret < 1) {
        return 0;
      }
      if (ret != (VMReturn *)0x0) {
        VMReturn::SetInt(ret,0);
        return 1;
      }
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x10b8,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_91 = ((dist_max._4_4_ & 2) != 0 ^ 0xffU) & 1;
    goto LAB_005233cb;
  }
  TAngle<double>::TAngle((TAngle<double> *)local_b0,(TAngle<double> *)((long)fov.Degrees + 0xb0));
  local_130 = 0.5;
  if ((dist_max._4_4_ & 0x800) == 0) {
    local_130 = 0.0;
  }
  TAngle<double>::TAngle(&local_b8,local_130);
  P_AimLineAttack((AActor *)local_c0,(DAngle *)angle.Degrees,2048.0,
                  (FTranslatedLineTarget *)local_b0,(DAngle *)auStack_90,(int)&local_b8,
                  (AActor *)0x20,(AActor *)0x0);
  if ((AActor *)_auStack_90 == (AActor *)0x0) {
    u_3 = 0;
    if (numret < 1) {
      return 0;
    }
    if (ret != (VMReturn *)0x0) {
      VMReturn::SetInt(ret,0);
      return 1;
    }
    __assert_fail("ret != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x10c4,
                  "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  viewport = (AActor *)_auStack_90;
  uVar1 = dist_max._4_4_ & 0x180;
  if (uVar1 == 0x80) {
LAB_0052339e:
    local_91 = ((dist_max._4_4_ & 2) != 0 ^ 0xffU) & 1;
  }
  else {
    if (uVar1 != 0x100) {
      if (uVar1 == 0x180) {
        TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffffb8,0.0);
        goto LAB_0052339e;
      }
      TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffffb8,0.0);
    }
    local_91 = 0;
  }
LAB_005233cb:
  bVar3 = false;
  if (((dist_max._4_4_ & 0x400) != 0) && (bVar3 = false, viewport->player == (player_t *)0x0)) {
    TFlags<ActorFlag3,_unsigned_int>::operator&
              ((TFlags<ActorFlag3,_unsigned_int> *)&u_4,
               (int)viewport + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
    uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&u_4);
    bVar3 = uVar1 == 0;
  }
  if (bVar3) {
    distance._4_4_ = 0;
    if (numret < 1) {
      param_local._4_4_ = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x10de,
                      "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      VMReturn::SetInt(ret,0);
      param_local._4_4_ = 1;
    }
  }
  else if (((dist_max._4_4_ & 0x200) == 0) ||
          (bVar3 = AActor::IsFriend((AActor *)fov.Degrees,viewport), !bVar3)) {
    _u_6 = (AActor *)AActor::Distance3D((AActor *)fov.Degrees,viewport,false);
    if (((dist_close == 0.0) && (!NAN(dist_close))) || ((double)_u_6 <= dist_close)) {
      if ((((double)target != 0.0) || (NAN((double)target))) && ((double)_u_6 < (double)target)) {
        if ((dist_max._4_4_ & 0x10) != 0) {
          local_e0 = 0;
          if (numret < 1) {
            return 0;
          }
          if (ret != (VMReturn *)0x0) {
            VMReturn::SetInt(ret,0);
            return 1;
          }
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x10ef,
                        "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if ((dist_max._4_4_ & 4) != 0) {
          TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffffb8,0.0);
        }
        if ((dist_max._4_4_ & 8) != 0) {
          local_91 = 0;
        }
      }
      if ((dist_max._4_4_ & 0x80) == 0) {
        t._24_8_ = fov.Degrees;
      }
      else {
        t._24_8_ = viewport;
        viewport = (AActor *)fov.Degrees;
      }
      if (((local_91 & 1) == 0) || (bVar3 = P_CheckSight((AActor *)t._24_8_,viewport,1), bVar3)) {
        if ((dist_max._4_4_ & 0x100) != 0) {
          if ((double)t._24_8_ == fov.Degrees) {
            t._24_8_ = viewport;
            viewport = (AActor *)fov.Degrees;
          }
          else {
            viewport = (AActor *)t._24_8_;
            t._24_8_ = fov.Degrees;
          }
        }
        TAngle<double>::TAngle
                  ((TAngle<double> *)&stack0xffffffffffffff08,
                   (TAngle<double> *)&stack0xffffffffffffffb8);
        TAngle<double>::TAngle(&an,360.0);
        MIN<TAngle<double>>((TAngle<double> *)&stack0xffffffffffffff10,
                            (TAngle<double> *)&stack0xffffffffffffff08);
        TAngle<double>::operator=
                  ((TAngle<double> *)&stack0xffffffffffffffb8,
                   (TAngle<double> *)&stack0xffffffffffffff10);
        bVar3 = TAngle<double>::operator>((TAngle<double> *)&stack0xffffffffffffffb8,0.0);
        if (bVar3) {
          AActor::AngleTo((AActor *)local_110,(AActor *)t._24_8_,SUB81(viewport,0));
          absangle<double>((TAngle<double> *)(local_110 + 8),(TAngle<double> *)local_110);
          TAngle<double>::operator/((TAngle<double> *)&u_9,2.0);
          bVar3 = TAngle<double>::operator>
                            ((TAngle<double> *)(local_110 + 8),(TAngle<double> *)&u_9);
          if (bVar3) {
            if (numret < 1) {
              return 0;
            }
            if (ret != (VMReturn *)0x0) {
              VMReturn::SetInt(ret,0);
              return 1;
            }
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x110e,
                          "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
        }
        if (numret < 1) {
          param_local._4_4_ = 0;
        }
        else {
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x1111,
                          "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          VMReturn::SetInt(ret,1);
          param_local._4_4_ = 1;
        }
      }
      else {
        local_e4 = 0;
        if (numret < 1) {
          param_local._4_4_ = 0;
        }
        else {
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x10fd,
                          "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          VMReturn::SetInt(ret,0);
          param_local._4_4_ = 1;
        }
      }
    }
    else {
      u_7 = 0;
      if (numret < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x10e9,
                        "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetInt(ret,0);
        param_local._4_4_ = 1;
      }
    }
  }
  else {
    distance._0_4_ = 0;
    if (numret < 1) {
      param_local._4_4_ = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x10e3,
                      "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      VMReturn::SetInt(ret,0);
      param_local._4_4_ = 1;
    }
  }
  return param_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckIfTargetInLOS)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_ANGLE_DEF	(fov)		
	PARAM_INT_DEF	(flags)		
	PARAM_FLOAT_DEF	(dist_max)	
	PARAM_FLOAT_DEF	(dist_close)

	AActor *target, *viewport;
	FTranslatedLineTarget t;

	bool doCheckSight;

	if (!self->player)
	{
		if (flags & JLOSF_CHECKMASTER)
		{
			target = self->master;
		}
		else if ((self->flags & MF_MISSILE && (flags & JLOSF_PROJECTILE)) || (flags & JLOSF_CHECKTRACER))
		{
			if ((self->flags2 & MF2_SEEKERMISSILE) || (flags & JLOSF_CHECKTRACER))
				target = self->tracer;
			else
				target = NULL;
		}
		else
		{
			target = self->target;
		}

		if (target == NULL)
		{ // [KS] Let's not call P_CheckSight unnecessarily in this case.
			ACTION_RETURN_BOOL(false);
		}
		if ((flags & JLOSF_DEADNOJUMP) && (target->health <= 0))
		{
			ACTION_RETURN_BOOL(false);
		}

		doCheckSight = !(flags & JLOSF_NOSIGHT);
	}
	else
	{
		// Does the player aim at something that can be shot?
		P_AimLineAttack(self, self->Angles.Yaw, MISSILERANGE, &t, (flags & JLOSF_NOAUTOAIM) ? 0.5 : 0., ALF_PORTALRESTRICT);
		
		if (!t.linetarget)
		{
			ACTION_RETURN_BOOL(false);
		}
		target = t.linetarget;

		switch (flags & (JLOSF_TARGETLOS|JLOSF_FLIPFOV))
		{
		case JLOSF_TARGETLOS|JLOSF_FLIPFOV:
			// target makes sight check, player makes fov check; player has verified fov
			fov = 0.;
			// fall-through
		case JLOSF_TARGETLOS:
			doCheckSight = !(flags & JLOSF_NOSIGHT); // The target is responsible for sight check and fov
			break;
		default:
			// player has verified sight and fov
			fov = 0.;
			// fall-through
		case JLOSF_FLIPFOV: // Player has verified sight, but target must verify fov
			doCheckSight = false;
			break;
		}
	}

	// [FDARI] If target is not a combatant, don't jump
	if ( (flags & JLOSF_COMBATANTONLY) && (!target->player) && !(target->flags3 & MF3_ISMONSTER))
	{
		ACTION_RETURN_BOOL(false);
	}
	// [FDARI] If actors share team, don't jump
	if ((flags & JLOSF_ALLYNOJUMP) && self->IsFriend(target))
	{
		ACTION_RETURN_BOOL(false);
	}
	double distance = self->Distance3D(target);

	if (dist_max && (distance > dist_max))
	{
		ACTION_RETURN_BOOL(false);
	}
	if (dist_close && (distance < dist_close))
	{
		if (flags & JLOSF_CLOSENOJUMP)
		{
			ACTION_RETURN_BOOL(false);
		}
		if (flags & JLOSF_CLOSENOFOV)
			fov = 0.;

		if (flags & JLOSF_CLOSENOSIGHT)
			doCheckSight = false;
	}

	if (flags & JLOSF_TARGETLOS) { viewport = target; target = self; }
	else { viewport = self; }

	if (doCheckSight && !P_CheckSight (viewport, target, SF_IGNOREVISIBILITY))
	{
		ACTION_RETURN_BOOL(false);
	}

	if (flags & JLOSF_FLIPFOV)
	{
		if (viewport == self) { viewport = target; target = self; }
		else { target = viewport; viewport = self; }
	}

	fov = MIN<DAngle>(fov, 360.);

	if (fov > 0)
	{
		DAngle an = absangle(viewport->AngleTo(target), viewport->Angles.Yaw);

		if (an > (fov / 2))
		{
			ACTION_RETURN_BOOL(false); // [KS] Outside of FOV - return
		}
	}
	ACTION_RETURN_BOOL(true);
}